

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr_cnv.cpp
# Opt level: O2

void __thiscall
icu_63::UnicodeString::doCodepageCreate
          (UnicodeString *this,char *codepageData,int32_t dataLength,char *codepage)

{
  char cVar1;
  UBool UVar2;
  uint in_EAX;
  size_t sVar3;
  UConverter *converter;
  char *pcVar4;
  char16_t *us;
  int32_t newCapacity;
  StringPiece utf8;
  UErrorCode status;
  undefined8 uStack_38;
  
  if (dataLength < -1) {
    return;
  }
  if (codepageData == (char *)0x0) {
    return;
  }
  sVar3 = (size_t)(uint)dataLength;
  if (dataLength == 0) {
    return;
  }
  uStack_38._0_4_ = in_EAX;
  if (dataLength == -1) {
    sVar3 = strlen(codepageData);
  }
  uStack_38 = (ulong)(uint)uStack_38;
  newCapacity = (int32_t)sVar3;
  if (codepage == (char *)0x0) {
    pcVar4 = ucnv_getDefaultName_63();
    if (*pcVar4 == 'u') {
      if ((pcVar4[1] == 't') && (pcVar4[2] == 'f')) goto LAB_0034a054;
    }
    else if ((*pcVar4 == 'U') && ((pcVar4[1] == 'T' && (pcVar4[2] == 'F')))) {
LAB_0034a054:
      if (pcVar4[3] == '8') {
        cVar1 = pcVar4[4];
      }
      else {
        if ((pcVar4[3] != '-') || (pcVar4[4] != '8')) goto LAB_0034a0a0;
        cVar1 = pcVar4[5];
      }
      if (cVar1 == '\0') {
        utf8._8_8_ = sVar3 & 0xffffffff;
        utf8.ptr_ = codepageData;
        setToUTF8(this,utf8);
        return;
      }
    }
LAB_0034a0a0:
    converter = u_getDefaultConverter_63((UErrorCode *)((long)&uStack_38 + 4));
  }
  else {
    if (*codepage == '\0') {
      UVar2 = cloneArrayIfNeeded(this,newCapacity,newCapacity,'\0',(int32_t **)0x0,'\0');
      if (UVar2 != '\0') {
        if (((this->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
          us = (this->fUnion).fFields.fArray;
        }
        else {
          us = (this->fUnion).fStackFields.fBuffer;
        }
        u_charsToUChars_63(codepageData,us,newCapacity);
        setLength(this,newCapacity);
        return;
      }
      goto LAB_0034a0b4;
    }
    converter = ucnv_open_63(codepage,(UErrorCode *)((long)&uStack_38 + 4));
  }
  if (uStack_38._4_4_ < 1) {
    doCodepageCreate(this,codepageData,newCapacity,converter,(UErrorCode *)((long)&uStack_38 + 4));
    if (0 < uStack_38._4_4_) {
      setToBogus(this);
    }
    if (codepage != (char *)0x0) {
      ucnv_close_63(converter);
      return;
    }
    u_releaseDefaultConverter_63(converter);
    return;
  }
LAB_0034a0b4:
  setToBogus(this);
  return;
}

Assistant:

void
UnicodeString::doCodepageCreate(const char *codepageData,
                                int32_t dataLength,
                                const char *codepage)
{
    // if there's nothing to convert, do nothing
    if(codepageData == 0 || dataLength == 0 || dataLength < -1) {
        return;
    }
    if(dataLength == -1) {
        dataLength = (int32_t)uprv_strlen(codepageData);
    }

    UErrorCode status = U_ZERO_ERROR;

    // create the converter
    // if the codepage is the default, use our cache
    // if it is an empty string, then use the "invariant character" conversion
    UConverter *converter;
    if (codepage == 0) {
        const char *defaultName = ucnv_getDefaultName();
        if(UCNV_FAST_IS_UTF8(defaultName)) {
            setToUTF8(StringPiece(codepageData, dataLength));
            return;
        }
        converter = u_getDefaultConverter(&status);
    } else if(*codepage == 0) {
        // use the "invariant characters" conversion
        if(cloneArrayIfNeeded(dataLength, dataLength, FALSE)) {
            u_charsToUChars(codepageData, getArrayStart(), dataLength);
            setLength(dataLength);
        } else {
            setToBogus();
        }
        return;
    } else {
        converter = ucnv_open(codepage, &status);
    }

    // if we failed, set the appropriate flags and return
    if(U_FAILURE(status)) {
        setToBogus();
        return;
    }

    // perform the conversion
    doCodepageCreate(codepageData, dataLength, converter, status);
    if(U_FAILURE(status)) {
        setToBogus();
    }

    // close the converter
    if(codepage == 0) {
        u_releaseDefaultConverter(converter);
    } else {
        ucnv_close(converter);
    }
}